

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

uint __thiscall ON_SubDEdge::FaceArrayIndex(ON_SubDEdge *this,ON_SubDFace *f)

{
  uint uVar1;
  uint local_34;
  uint efi;
  ON_SubDFacePtr *fptr;
  uint face_count;
  ON_SubDFace *f_local;
  ON_SubDEdge *this_local;
  
  if ((f != (ON_SubDFace *)0x0) && (uVar1 = (uint)this->m_face_count, uVar1 != 0)) {
    if (f == (ON_SubDFace *)(this->m_face2[0].m_ptr & 0xfffffffffffffff8)) {
      return 0;
    }
    if (1 < uVar1) {
      if (f == (ON_SubDFace *)(this->m_face2[1].m_ptr & 0xfffffffffffffff8)) {
        return 1;
      }
      if ((2 < uVar1) && (this->m_facex != (ON_SubDFacePtr *)0x0)) {
        for (local_34 = 2; local_34 < uVar1; local_34 = local_34 + 1) {
          if (f == (ON_SubDFace *)(this->m_facex[(ulong)local_34 - 2].m_ptr & 0xfffffffffffffff8)) {
            return local_34;
          }
        }
      }
    }
  }
  return 0xffffffff;
}

Assistant:

unsigned int ON_SubDEdge::FaceArrayIndex(
  const ON_SubDFace* f
  ) const
{
  if (nullptr == f)
    return ON_UNSET_UINT_INDEX;
  const unsigned int face_count = m_face_count;
  if (face_count > 0)
  {
    if (f == ON_SUBD_FACE_POINTER(m_face2[0].m_ptr))
      return 0;
    if (face_count > 1)
    {
      if (f == ON_SUBD_FACE_POINTER(m_face2[1].m_ptr))
        return 1;
      if (face_count > 2 && nullptr != m_facex)
      {
        const ON_SubDFacePtr* fptr = m_facex - 2;
        for (unsigned int efi = 2; efi < face_count; efi++)
        {
          if (f == ON_SUBD_FACE_POINTER(fptr[efi].m_ptr))
            return efi;
        }
      }
    }
  }
  return ON_UNSET_UINT_INDEX;
}